

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>
mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>(Impl *impl)

{
  AssertionFailure *this;
  
  if ((impl != (Impl *)0x0) && (0x15 < impl->kind_ - BOOL)) {
    this = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this,"invalid expression kind");
    __cxa_throw(this,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  return (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)(ExprBase)impl;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }